

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O2

bool __thiscall
GLRParser::checkProductionRules
          (GLRParser *this,
          vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
          *possibleParseStacks,
          stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *stack,stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>
                 *productions,GLRState *currentState,
          set<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>,_std::less<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>_>
          *alreadyReducedStacks,bool final)

{
  Production *this_00;
  pointer pbVar1;
  pointer pbVar2;
  pointer pbVar3;
  long lVar4;
  int *piVar5;
  __type _Var6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  iterator iVar9;
  ParseOperation *this_01;
  _Rb_tree_node_base *p_Var10;
  string *psVar11;
  GLRState *currentState_00;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  _Elt_pointer pbVar14;
  int i;
  ulong uVar15;
  byte bVar16;
  string stateName;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  newStack;
  string newVariable;
  set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
  parseOperations;
  set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
  parseOperationsb;
  stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_> newProductions;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  newNewStack;
  
  if (currentState->accepting == true) {
    parseOperations._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &parseOperations._M_t._M_impl.super__Rb_tree_header._M_header;
    parseOperations._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    parseOperations._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    parseOperations._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    parseOperations._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         parseOperations._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var10 = (currentState->productions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var10 !=
        &(currentState->productions)._M_t._M_impl.super__Rb_tree_header;
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
      this_00 = *(Production **)(p_Var10 + 1);
      pvVar7 = Production::getToP_abi_cxx11_(this_00);
      pvVar8 = Production::getToP_abi_cxx11_(this_00);
      pbVar1 = (pvVar8->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (pvVar8->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pbVar3 = (pvVar7->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      getMarker_abi_cxx11_();
      _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)pbVar2 + (long)pbVar3 + (-0x20 - (long)pbVar1)),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &newProductions);
      if (_Var6) {
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&newStack,&stack->c);
        iVar9 = std::
                _Rb_tree<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>,_std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>,_std::_Identity<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>,_std::less<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>_>
                ::find(&alreadyReducedStacks->_M_t,(key_type *)&newStack);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&newStack);
        std::__cxx11::string::~string((string *)&newProductions);
        if ((_Rb_tree_header *)iVar9._M_node ==
            &(alreadyReducedStacks->_M_t)._M_impl.super__Rb_tree_header) {
          this_01 = (ParseOperation *)operator_new(0x18);
          ParseOperation::ParseOperation(this_01,this_00);
          newStack.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)this_01;
          std::
          _Rb_tree<ParseOperation*,ParseOperation*,std::_Identity<ParseOperation*>,std::less<ParseOperation*>,std::allocator<ParseOperation*>>
          ::_M_insert_unique<ParseOperation*>
                    ((_Rb_tree<ParseOperation*,ParseOperation*,std::_Identity<ParseOperation*>,std::less<ParseOperation*>,std::allocator<ParseOperation*>>
                      *)&parseOperations,(ParseOperation **)&newStack);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&newStack,&stack->c);
          std::
          _Rb_tree<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>,std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>,std::_Identity<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>>,std::less<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>>,std::allocator<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>>>
          ::
          _M_insert_unique<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>>
                    ((_Rb_tree<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>,std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>,std::_Identity<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>>,std::less<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>>,std::allocator<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,Production*>>>
                      *)alreadyReducedStacks,(key_type *)&newStack);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&newStack);
        }
      }
      else {
        std::__cxx11::string::~string((string *)&newProductions);
      }
    }
    bVar16 = 0;
    for (p_Var13 = parseOperations._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var13 != &parseOperations._M_t._M_impl.super__Rb_tree_header;
        p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
      lVar4 = *(long *)(p_Var13 + 1);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::deque(&newStack.c,&stack->c);
      std::deque<Production_*,_std::allocator<Production_*>_>::deque
                (&newProductions.c,&productions->c);
      uVar15 = 0;
      while( true ) {
        pvVar7 = Production::getToP_abi_cxx11_(*(Production **)(lVar4 + 8));
        if (((long)(pvVar7->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar7->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U <= uVar15) break;
        if (newStack.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            newStack.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back(&newStack.c);
          if (newStack.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
              newStack.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur) {
            std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::pop_back(&newStack.c);
          }
        }
        uVar15 = uVar15 + 1;
      }
      if (newStack.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          newStack.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        psVar11 = Production::getFromP_abi_cxx11_(*(Production **)(lVar4 + 8));
        std::__cxx11::string::string((string *)&newVariable,(string *)psVar11);
        pbVar14 = newStack.c.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (newStack.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            newStack.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pbVar14 = newStack.c.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
        }
        currentState_00 = findState(this,pbVar14 + -1);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&newStack.c,&newVariable);
        newNewStack.c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map = *(_Map_pointer *)(lVar4 + 8);
        std::deque<Production*,std::allocator<Production*>>::emplace_back<Production*>
                  ((deque<Production*,std::allocator<Production*>> *)&newProductions,
                   (Production **)&newNewStack);
        findParseOptions(&parseOperationsb,this,&newVariable,currentState_00);
        for (p_Var12 = parseOperationsb._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var12 != &parseOperationsb._M_t._M_impl.super__Rb_tree_header;
            p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
          piVar5 = *(int **)(p_Var12 + 1);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::deque(&newNewStack.c,&newStack.c);
          stateName._M_dataplus._M_p = (pointer)&stateName.field_2;
          stateName._M_string_length = 0;
          stateName.field_2._M_local_buf[0] = '\0';
          if (*piVar5 == 3) {
            std::__cxx11::string::assign((char *)&stateName);
            bVar16 = final;
          }
          else {
            std::__cxx11::string::_M_assign((string *)&stateName);
          }
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&newNewStack.c,&stateName);
          std::
          vector<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>,std::allocator<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>>>
          ::
          emplace_back<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>&>
                    ((vector<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>,std::allocator<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>>>
                      *)possibleParseStacks,&newNewStack,&newProductions);
          std::__cxx11::string::~string((string *)&stateName);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~deque(&newNewStack.c);
        }
        std::
        _Rb_tree<ParseOperation_*,_ParseOperation_*,_std::_Identity<ParseOperation_*>,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
        ::~_Rb_tree(&parseOperationsb._M_t);
        std::__cxx11::string::~string((string *)&newVariable);
      }
      std::_Deque_base<Production_*,_std::allocator<Production_*>_>::~_Deque_base
                ((_Deque_base<Production_*,_std::allocator<Production_*>_> *)&newProductions);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~deque(&newStack.c);
    }
    std::
    _Rb_tree<ParseOperation_*,_ParseOperation_*,_std::_Identity<ParseOperation_*>,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
    ::~_Rb_tree(&parseOperations._M_t);
  }
  else {
    bVar16 = 0;
  }
  return (bool)(bVar16 & 1);
}

Assistant:

bool
GLRParser::checkProductionRules(
        vector<pair<std::stack<std::string>, std::stack<Production *>>> &possibleParseStacks,
        const std::stack<std::string> &stack,
        const std::stack<Production *> &productions,
        const GLRState *currentState,
        set<pair<std::stack<std::string>, Production *>> &alreadyReducedStacks,
        bool final) {// Check for possible reduces

    bool finalStack = false;
    if (currentState->isAccepting()) {
        // TODO: push production on stack
        set<ParseOperation *> parseOperations;

        // Find the possible reduces
        for (auto prod: currentState->getProductions()) {
            if (prod->getToP()[prod->getToP().size() - 1] == getMarker() &&
                alreadyReducedStacks.find(std::pair<std::stack<std::string>, Production *>(stack, prod)) ==
                alreadyReducedStacks.end()) {
                parseOperations.insert(new ParseOperation(prod));
                alreadyReducedStacks.insert(std::pair<std::stack<std::string>, Production *>(stack, prod));
            }
        }

        for (ParseOperation *parseOperation: parseOperations) {
            std::stack<std::string> newStack = stack;
            std::stack<Production *> newProductions = productions;

            // Pop the left side of the production from the stack
            for (int i = 0; i < parseOperation->getReduceProduction()->getToP().size() - 1; ++i) {
                // pop all elements from the stack (exclude the marker)
                if(!newStack.empty())
                    newStack.pop(); // pop the state marker
                if(!newStack.empty())
                    newStack.pop(); // pop the string element
            }

            if(newStack.empty())
                continue;

            // Push the right side and determine the new top state
            string newVariable = parseOperation->getReduceProduction()->getFromP();
            GLRState *currentTopState = findState(newStack.top());
            newStack.push(newVariable);
            newProductions.push(parseOperation->getReduceProduction());

            set<ParseOperation *> parseOperationsb = findParseOptions(newVariable, currentTopState);

            for (auto stackOp: parseOperationsb) {

                // For every new possible stack, create a new state
                std::stack<string> newNewStack = newStack;
                std::string stateName;
                if (stackOp->getOperationType() == ParseOperation::accept) {
//                    if (!final) {
//                        continue;
//                    }
//                    std::stack<std::string> acceptStack;
//                    acceptStack.push("accept");
//                    possibleParseStacks.emplace_back(acceptStack,
//                                                     newProductions);
                    finalStack = final;
                    stateName = "accept";
                } else {
                    stateName = stackOp->getNewState()->getName();
                }
                newNewStack.push(stateName);
                // Add this to the possibleParseStacks, so it can still be evaluated this round. (because this stack hasn't yet consumed char c)
                possibleParseStacks.emplace_back(newNewStack,
                                                 newProductions); // i (on which we're iterating) mustn't decrease, because we're checking the size & inserting at the end

//                cout << "Reduced, new stack: ";
//                printStack(newNewStack);
//                cout << endl;
            }
        }
    }


    return finalStack;
}